

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::set_level(logger *this,level_enum log_level)

{
  undefined4 in_ESI;
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  *(undefined4 *)(in_RDI + 0x40) = in_ESI;
  UNLOCK();
  return;
}

Assistant:

SPDLOG_INLINE void logger::set_level(level::level_enum log_level)
{
    level_.store(log_level);
}